

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

put_transaction<void> * __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
::start_dyn_push_copy
          (put_transaction<void> *__return_storage_ptr__,
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
          *this,runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                *i_type,void *i_source)

{
  Allocation AVar1;
  put_transaction<void> local_48;
  
  AVar1 = heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
          ::inplace_allocate<0ul,true>
                    ((heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
                      *)this,(i_type->m_feature_table->
                             super__Tuple_impl<0UL,_density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                             ).
                             super__Tuple_impl<1UL,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                             .
                             super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                             .
                             super__Tuple_impl<3UL,_density::f_destroy,_density::f_size,_density::f_alignment>
                             .super__Tuple_impl<4UL,_density::f_size,_density::f_alignment>.
                             super__Head_base<4UL,_density::f_size,_false>._M_head_impl.m_size,
                     (size_t)(i_type->m_feature_table->
                             super__Tuple_impl<0UL,_density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                             ).
                             super__Tuple_impl<1UL,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                             .
                             super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                             .
                             super__Tuple_impl<3UL,_density::f_destroy,_density::f_size,_density::f_alignment>
                             .super__Tuple_impl<4UL,_density::f_size,_density::f_alignment>.
                             super__Tuple_impl<5UL,_density::f_alignment>.
                             super__Head_base<5UL,_density::f_alignment,_false>);
  AVar1.m_control_block[1].m_next = (uintptr_t)i_type->m_feature_table;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  ::copy_construct(i_type,AVar1.m_user_storage,i_source);
  __return_storage_ptr__->m_queue = this;
  __return_storage_ptr__->m_put_data = AVar1;
  local_48.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  local_48.m_put_data = AVar1;
  put_transaction<void>::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> start_dyn_push_copy(const RUNTIME_TYPE & i_type, const void * i_source)
        {
            auto push_data = inplace_allocate<0, true>(i_type.size(), i_type.alignment());

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.copy_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }